

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

date_t duckdb::TryCastCInternal<duckdb::uhugeint_t,duckdb::date_t,duckdb::TryCast>
                 (duckdb_result *result,idx_t col,idx_t row)

{
  void *pvVar1;
  bool bVar2;
  uhugeint_t input;
  date_t result_value;
  date_t local_c;
  
  pvVar1 = result->deprecated_columns[col].deprecated_data;
  input.upper = *(uint64_t *)((long)pvVar1 + row * 0x10 + 8);
  input.lower = *(uint64_t *)((long)pvVar1 + row * 0x10);
  bVar2 = TryCast::Operation<duckdb::uhugeint_t,duckdb::date_t>(input,&local_c,false);
  if (!bVar2) {
    local_c = FetchDefaultValue::Operation<duckdb::date_t>();
  }
  return (date_t)local_c.days;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}